

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O3

istream * amrex::operator>>(istream *is,RealDescriptor *rd)

{
  pointer plVar1;
  pointer plVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  char c_2;
  char c;
  Vector<int,_std::allocator<int>_> ord;
  int size;
  Vector<long,_std::allocator<long>_> fmt;
  char local_8a;
  char local_89;
  vector<int,_std::allocator<int>_> local_88;
  RealDescriptor local_68;
  vector<long,_std::allocator<long>_> local_38;
  
  std::operator>>(is,&local_89);
  if (local_89 != '(') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \'(\'");
  }
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (Long *)0x0;
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::istream::operator>>((istream *)is,(int *)&local_68);
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != ',') {
    Error_host("getarray(istream&): expected a \',\'");
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::vector<long,_std::allocator<long>_>::resize
            (&local_38,
             (long)(int)local_68.fr.super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (0 < (int)local_68.fr.super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start) {
    lVar5 = 0;
    do {
      std::istream::_M_extract<long>((long *)is);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)local_68.fr.super_vector<long,_std::allocator<long>_>.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_89);
  if (local_89 != ',') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \',\'");
  }
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::operator>>(is,&local_8a);
  if (local_8a != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::istream::operator>>((istream *)is,(int *)&local_68);
  std::operator>>(is,&local_8a);
  if (local_8a != ',') {
    Error_host("getarray(istream&): expected a \',\'");
  }
  std::operator>>(is,&local_8a);
  if (local_8a != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&local_88,
             (long)(int)local_68.fr.super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (0 < (int)local_68.fr.super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      std::istream::operator>>
                ((istream *)is,
                 (int *)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar6));
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar5 < (int)local_68.fr.super_vector<long,_std::allocator<long>_>.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::operator>>(is,&local_8a);
  if (local_8a != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_8a);
  if (local_8a != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_89);
  if (local_89 != ')') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \')\'");
  }
  RealDescriptor::RealDescriptor
            (&local_68,
             local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(int)((ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2));
  plVar1 = (rd->fr).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar2 = (rd->fr).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (rd->fr).super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.fr.super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (rd->fr).super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.fr.super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  (rd->fr).super_vector<long,_std::allocator<long>_>.super__Vector_base<long,_std::allocator<long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.fr.super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_68.fr.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.fr.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.fr.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)plVar2 - (long)plVar1);
  }
  piVar3 = (rd->ord).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (rd->ord).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (rd->ord).super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.ord.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  (rd->ord).super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.ord.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  (rd->ord).super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.ord.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_68.ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.ord.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    if (local_68.ord.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_68.ord.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_68.ord.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_68.ord.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
  }
  if (local_68.fr.super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_68.fr.super_vector<long,_std::allocator<long>_>.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_68.fr.super_vector<long,_std::allocator<long>_>.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_68.fr.super_vector<long,_std::allocator<long>_>.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (Long *)0x0) {
    operator_delete(local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return is;
}

Assistant:

std::istream&
operator>> (std::istream&   is,
            RealDescriptor& rd)
{
    char c;
    is >> c;
    if (c != '(')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \'(\'");
    Vector<Long> fmt;
    getarray(is, fmt);
    is >> c;
    if (c != ',')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \',\'");
    Vector<int> ord;
    getarray(is, ord);
    is >> c;
    if (c != ')')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \')\'");
    rd = RealDescriptor(fmt.dataPtr(),ord.dataPtr(),ord.size());
    return is;
}